

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_content_with_length
               (Stream *strm,uint64_t len,Progress *progress,ContentReceiverWithProgress *out)

{
  bool bVar1;
  int iVar2;
  unsigned_long *puVar3;
  undefined4 extraout_var;
  unsigned_long local_1058;
  unsigned_long local_1050;
  ssize_t n;
  size_t read_len;
  uint64_t r;
  char buf [4096];
  ContentReceiverWithProgress *out_local;
  Progress *progress_local;
  uint64_t len_local;
  Stream *strm_local;
  
  read_len = 0;
  do {
    if (len <= read_len) {
      return true;
    }
    n = len - read_len;
    local_1058 = 0x1000;
    puVar3 = std::min<unsigned_long>((unsigned_long *)&n,&local_1058);
    iVar2 = (*strm->_vptr_Stream[4])(strm,&r,*puVar3);
    local_1050 = CONCAT44(extraout_var,iVar2);
    if ((long)local_1050 < 1) {
      return false;
    }
    bVar1 = std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::
            operator()(out,(char *)&r,local_1050,read_len,len);
    if (!bVar1) {
      return false;
    }
    read_len = local_1050 + read_len;
    bVar1 = std::function::operator_cast_to_bool((function *)progress);
  } while ((!bVar1) ||
          (bVar1 = std::function<bool_(unsigned_long,_unsigned_long)>::operator()
                             (progress,read_len,len), bVar1));
  return false;
}

Assistant:

inline bool read_content_with_length(Stream &strm, uint64_t len,
                                     Progress progress,
                                     ContentReceiverWithProgress out) {
  char buf[CPPHTTPLIB_RECV_BUFSIZ];

  uint64_t r = 0;
  while (r < len) {
    auto read_len = static_cast<size_t>(len - r);
    auto n = strm.read(buf, (std::min)(read_len, CPPHTTPLIB_RECV_BUFSIZ));
    if (n <= 0) { return false; }

    if (!out(buf, static_cast<size_t>(n), r, len)) { return false; }
    r += static_cast<uint64_t>(n);

    if (progress) {
      if (!progress(r, len)) { return false; }
    }
  }

  return true;
}